

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::checkUniqueResetOrders(ValidatorImpl *this,ModelPtr *model)

{
  _Base_ptr this_00;
  IssueImpl *this_01;
  long *plVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  size_type *psVar4;
  IssuePtr issue;
  vector<int,_std::allocator<int>_> orders;
  ResetOrderMap resetOrderMap;
  set<int,_std::less<int>,_std::allocator<int>_> ordersSet;
  IssuePtr local_130;
  vector<int,_std::allocator<int>_> local_120;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  ValidatorImpl *local_c8;
  ModelPtr *local_c0;
  NamedEntity *local_b8;
  string local_b0;
  _Rb_tree<std::shared_ptr<libcellml::Variable>,_std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_c8 = this;
  local_c0 = model;
  buildModelResetOrderMap((ResetOrderMap *)&local_90,this,model);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    p_Var2 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_b8 = *(NamedEntity **)(p_Var2 + 1);
      this_00 = p_Var2[1]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_120,(vector<int,_std::allocator<int>_> *)&p_Var2[1]._M_left);
      std::set<int,std::less<int>,std::allocator<int>>::
      set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((set<int,std::less<int>,std::allocator<int>> *)&local_60,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count <
          (ulong)((long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        Issue::IssueImpl::create();
        Issue::IssueImpl::setReferenceRule
                  ((local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,RESET_ORDER_UNIQUE);
        this_01 = (local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->mPimpl;
        NamedEntity::name_abi_cxx11_(&local_b0,local_b8);
        plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x29da21);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_f8 = *plVar3;
          lStack_f0 = plVar1[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar3;
          local_108 = (long *)*plVar1;
        }
        local_100 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_108);
        psVar4 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_e8.field_2._M_allocated_capacity = *psVar4;
          local_e8.field_2._8_8_ = plVar1[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar4;
          local_e8._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_e8._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        Issue::IssueImpl::setDescription(this_01,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  ((((local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,local_c0,MODEL);
        Logger::LoggerImpl::addIssue(&local_c8->super_LoggerImpl,&local_130);
        if (local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_90._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::shared_ptr<libcellml::Variable>,_std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void Validator::ValidatorImpl::checkUniqueResetOrders(const ModelPtr &model)
{
    auto resetOrderMap = buildModelResetOrderMap(model);
    for (const auto &variableOrder : resetOrderMap) {
        auto variable = variableOrder.first;
        auto orders = variableOrder.second;

        std::set<int> ordersSet(orders.begin(), orders.end());

        if (ordersSet.size() < orders.size()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_UNIQUE);
            issue->mPimpl->setDescription("Variable '" + variable->name() + "' used in resets does not have unique order values across the equivalent variable set.");
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
    }
}